

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::load_parrec(CImgList<unsigned_char> *this,char *filename)

{
  float fVar1;
  float fVar2;
  uint *puVar3;
  float *pfVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  CImgList<float> *pCVar8;
  CImgList<unsigned_int> *pCVar9;
  FILE *pFVar10;
  CImgList<unsigned_char> *pCVar11;
  size_t sVar12;
  CImg<unsigned_char> *pCVar13;
  CImgArgumentException *pCVar14;
  CImgIOException *pCVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  char *__s;
  ulong uVar19;
  ulong uVar20;
  CImgList<unsigned_char> *this_00;
  uint **ppuVar21;
  pointer_____offset_0x10___ *ppuVar22;
  char *pcVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  uint sn;
  CImg<unsigned_char> buf;
  uint sizey;
  uint sizex;
  CImgList<unsigned_int> st_global;
  CImgList<float> st_slices;
  uint pixsize;
  float ss;
  float ri;
  float rs;
  char filenamerec [1024];
  char filenamepar [1024];
  char line [256];
  char body [1024];
  float *pfVar27;
  undefined4 uVar28;
  uint local_dec;
  CImg<float> local_de8;
  float local_dc4;
  uint local_dc0;
  uint local_dbc;
  CImgList<unsigned_char> *local_db8;
  ulong local_db0;
  CImgList<unsigned_int> local_da8;
  CImgList<float> local_d98;
  FILE *local_d80;
  ulong local_d78;
  long local_d70;
  float local_d68;
  float local_d64;
  float local_d60;
  float local_d5c;
  float local_d58;
  uint local_d54;
  char *local_d50;
  float local_d44;
  float local_d40;
  float local_d3c;
  char local_d38;
  char local_d37;
  char local_938;
  char local_937;
  char local_538 [256];
  char local_438 [1032];
  
  if (filename == (char *)0x0) {
    pCVar15 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)pCVar15,
               "[instance(%u,%u,%p)] CImgList<%s>::load_parrec() : Specified filename is (null).",
               (ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char");
    ppuVar22 = &CImgArgumentException::typeinfo;
  }
  else {
    memset(local_438,0,0x400);
    memset(&local_938,0,0x400);
    memset(&local_d38,0,0x400);
    pcVar23 = filename;
    do {
      __s = pcVar23;
      pcVar6 = strchr(__s,0x2e);
      pcVar23 = pcVar6 + 1;
    } while (filename <= pcVar6 + 1);
    if (__s == filename) {
      strcpy(local_438,filename);
      sVar7 = strlen(filename);
      __s = filename + sVar7;
    }
    else {
      uVar20 = (ulong)(~(uint)filename + (int)__s);
      memcpy(local_438,filename,uVar20);
      local_438[uVar20] = '\0';
    }
    iVar5 = strcmp(__s,"par");
    if (iVar5 == 0) {
      strncpy(&local_938,filename,0x3ff);
      snprintf(&local_d38,0x400,"%s.rec",local_438);
    }
    iVar5 = strcmp(__s,"PAR");
    if (iVar5 == 0) {
      strncpy(&local_938,filename,0x3ff);
      snprintf(&local_d38,0x400,"%s.REC",local_438);
    }
    iVar5 = strcmp(__s,"rec");
    if (iVar5 == 0) {
      strncpy(&local_d38,filename,0x3ff);
      snprintf(&local_938,0x400,"%s.par",local_438);
    }
    iVar5 = strcmp(__s,"REC");
    if (iVar5 == 0) {
      strncpy(&local_d38,filename,0x3ff);
      snprintf(&local_938,0x400,"%s.PAR",local_438);
    }
    if ((local_938 != '-') || (pFVar10 = _stdin, local_937 != '.')) {
      pFVar10 = fopen(&local_938,"r");
    }
    if (pFVar10 != (FILE *)0x0) {
      local_d98._width = 0;
      local_d98._allocated_width = 0;
      local_d98._data = (CImg<float> *)0x0;
      local_da8._width = 0;
      local_da8._allocated_width = 0;
      local_da8._data = (CImg<unsigned_int> *)0x0;
      memset(local_538,0,0x100);
      do {
        iVar5 = __isoc99_fscanf(pFVar10,"%255[^\n]%*c",local_538);
        if (iVar5 == -1) break;
      } while ((local_538[0] == '#') || (local_538[0] == '.'));
      local_db8 = this;
      local_d80 = pFVar10;
      local_d50 = filename;
      do {
        pfVar27 = &local_d40;
        iVar5 = __isoc99_fscanf(local_d80,"%u%*u%*u%*u%*u%*u%*u%u%*u%u%u%g%g%g%*[^\n]",&local_dec,
                                &local_d54,&local_dbc,&local_dc0,&local_d40,&local_d3c,&local_d44);
        if (iVar5 != 7) {
          if ((local_d38 != '-') || (pFVar10 = _stdin, local_d37 != '.')) {
            pFVar10 = fopen(&local_d38,"rb");
          }
          this_00 = local_db8;
          if (pFVar10 == (FILE *)0x0) {
            pCVar15 = (CImgIOException *)__cxa_allocate_exception(0x4008);
            CImgIOException::CImgIOException
                      (pCVar15,"cimg::fopen() : Failed to open file \'%s\' with mode \'%s\'.",
                       &local_d38,"rb");
          }
          else {
            if (0 < (int)local_da8._width) {
              lVar26 = 0x18;
              lVar24 = 0;
              do {
                puVar3 = *(uint **)((long)&(local_da8._data)->_width + lVar26);
                CImg<unsigned_char>::CImg
                          ((CImg<unsigned_char> *)&local_de8,*puVar3,puVar3[1],puVar3[2],1);
                uVar18 = this_00->_width;
                pCVar11 = insert(this_00,1,uVar18);
                CImg<unsigned_char>::move_to
                          ((CImg<unsigned_char> *)&local_de8,pCVar11->_data + uVar18);
                if ((local_de8._is_shared == false) && (local_de8._data != (float *)0x0)) {
                  operator_delete__(local_de8._data);
                }
                lVar24 = lVar24 + 1;
                lVar26 = lVar26 + 0x20;
              } while (lVar24 < (int)local_da8._width);
            }
            if (0 < (int)local_d98._width) {
              lVar24 = 0;
              do {
                uVar28 = (undefined4)((ulong)pfVar27 >> 0x20);
                pfVar4 = local_d98._data[lVar24]._data;
                iVar25 = (int)(long)*pfVar4 + -1;
                local_d78 = (ulong)pfVar4[7];
                local_dc4 = pfVar4[4];
                fVar1 = pfVar4[5];
                fVar2 = pfVar4[6];
                iVar5 = (int)(long)pfVar4[1];
                uVar16 = (uint)(long)pfVar4[3];
                uVar18 = (uint)(long)pfVar4[2];
                local_d70 = lVar24;
                if (iVar5 == 0x20) {
                  CImg<unsigned_int>::CImg((CImg<unsigned_int> *)&local_de8,uVar18,uVar16,1,1);
                  pfVar4 = local_de8._data;
                  uVar16 = uVar16 * uVar18;
                  uVar20 = (ulong)uVar16;
                  if ((uVar16 == 0) || (local_de8._data == (float *)0x0)) {
                    pCVar14 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
                    pcVar23 = "";
                    if (1 < uVar16) {
                      pcVar23 = "s";
                    }
                    CImgArgumentException::CImgArgumentException
                              (pCVar14,
                               "cimg::fread() : Invalid reading request of %u %s%s from file %p to buffer %p."
                               ,(ulong)uVar16,"unsigned int",pcVar23,pFVar10,local_de8._data);
                    __cxa_throw(pCVar14,&CImgArgumentException::typeinfo,std::exception::~exception)
                    ;
                  }
                  uVar19 = 0;
                  local_db0 = uVar20;
                  do {
                    sVar7 = 0xfc0000;
                    if ((uint)uVar20 < 0xfc0000) {
                      sVar7 = uVar20;
                    }
                    sVar12 = fread(pfVar4 + uVar19,4,sVar7,pFVar10);
                    iVar5 = (int)sVar12;
                    uVar18 = (int)uVar19 + iVar5;
                    uVar19 = (ulong)uVar18;
                    uVar16 = (uint)uVar20 - iVar5;
                    uVar20 = (ulong)uVar16;
                  } while (((int)sVar7 == iVar5) && (uVar16 != 0));
                  if (uVar16 != 0) {
                    cimg::warn("cimg::fread() : Only %u/%u elements could be read from file.",
                               (ulong)uVar18,local_db0);
                  }
                  if (0 < (int)local_db8->_data[local_d78 & 0xffffffff]._height) {
                    pCVar13 = local_db8->_data + (local_d78 & 0xffffffff);
                    iVar5 = 0;
                    do {
                      uVar18 = pCVar13->_width;
                      if (0 < (int)uVar18) {
                        iVar17 = 0;
                        do {
                          pCVar13->_data[(pCVar13->_height * iVar25 + iVar5) * uVar18 + iVar17] =
                               (uchar)(int)(((float)(uint)local_de8._data
                                                          [local_de8._width * iVar5 + iVar17] *
                                             fVar1 + local_dc4) / (fVar2 * fVar1));
                          iVar17 = iVar17 + 1;
                          uVar18 = pCVar13->_width;
                        } while (iVar17 < (int)uVar18);
                      }
                      iVar5 = iVar5 + 1;
                    } while (iVar5 < (int)pCVar13->_height);
                  }
                }
                else if (iVar5 == 0x10) {
                  CImg<unsigned_short>::CImg((CImg<unsigned_short> *)&local_de8,uVar18,uVar16,1,1);
                  pfVar4 = local_de8._data;
                  uVar16 = uVar16 * uVar18;
                  uVar20 = (ulong)uVar16;
                  if ((uVar16 == 0) || (local_de8._data == (float *)0x0)) {
                    pCVar14 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
                    pcVar23 = "";
                    if (1 < uVar16) {
                      pcVar23 = "s";
                    }
                    CImgArgumentException::CImgArgumentException
                              (pCVar14,
                               "cimg::fread() : Invalid reading request of %u %s%s from file %p to buffer %p."
                               ,(ulong)uVar16,"unsigned short",pcVar23,pFVar10,local_de8._data);
                    __cxa_throw(pCVar14,&CImgArgumentException::typeinfo,std::exception::~exception)
                    ;
                  }
                  uVar19 = 0;
                  local_db0 = uVar20;
                  do {
                    sVar7 = 0x1f80000;
                    if ((uint)uVar20 < 0x1f80000) {
                      sVar7 = uVar20;
                    }
                    sVar12 = fread((void *)((long)pfVar4 + uVar19 * 2),2,sVar7,pFVar10);
                    iVar5 = (int)sVar12;
                    uVar18 = (int)uVar19 + iVar5;
                    uVar19 = (ulong)uVar18;
                    uVar16 = (uint)uVar20 - iVar5;
                    uVar20 = (ulong)uVar16;
                  } while (((int)sVar7 == iVar5) && (uVar16 != 0));
                  if (uVar16 != 0) {
                    cimg::warn("cimg::fread() : Only %u/%u elements could be read from file.",
                               (ulong)uVar18,local_db0);
                  }
                  if (0 < (int)local_db8->_data[local_d78 & 0xffffffff]._height) {
                    pCVar13 = local_db8->_data + (local_d78 & 0xffffffff);
                    iVar5 = 0;
                    do {
                      uVar18 = pCVar13->_width;
                      if (0 < (int)uVar18) {
                        iVar17 = 0;
                        do {
                          pCVar13->_data[(pCVar13->_height * iVar25 + iVar5) * uVar18 + iVar17] =
                               (uchar)(int)(((float)*(ushort *)
                                                     ((long)local_de8._data +
                                                     (ulong)(local_de8._width * iVar5 + iVar17) * 2)
                                             * fVar1 + local_dc4) / (fVar2 * fVar1));
                          iVar17 = iVar17 + 1;
                          uVar18 = pCVar13->_width;
                        } while (iVar17 < (int)uVar18);
                      }
                      iVar5 = iVar5 + 1;
                    } while (iVar5 < (int)pCVar13->_height);
                  }
                }
                else {
                  if (iVar5 != 8) {
                    cimg::fclose(local_d80);
                    cimg::fclose(pFVar10);
                    pCVar15 = (CImgIOException *)__cxa_allocate_exception(0x4008);
                    CImgIOException::CImgIOException
                              (pCVar15,
                               "[instance(%u,%u,%p)] CImgList<%s>::load_parrec() : Unsupported %d-bits pixel type for file \'%s\'."
                               ,(ulong)local_db8->_width,(ulong)local_db8->_allocated_width,
                               local_db8->_data,"unsigned char",CONCAT44(uVar28,iVar5),local_d50);
                    __cxa_throw(pCVar15,&CImgIOException::typeinfo,std::exception::~exception);
                  }
                  CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&local_de8,uVar18,uVar16,1,1);
                  pfVar4 = local_de8._data;
                  uVar16 = uVar16 * uVar18;
                  uVar20 = (ulong)uVar16;
                  if ((uVar16 == 0) || (local_de8._data == (float *)0x0)) {
                    pCVar14 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
                    pcVar23 = "";
                    if (1 < uVar16) {
                      pcVar23 = "s";
                    }
                    CImgArgumentException::CImgArgumentException
                              (pCVar14,
                               "cimg::fread() : Invalid reading request of %u %s%s from file %p to buffer %p."
                               ,(ulong)uVar16,"unsigned char",pcVar23,pFVar10,local_de8._data);
                    __cxa_throw(pCVar14,&CImgArgumentException::typeinfo,std::exception::~exception)
                    ;
                  }
                  uVar18 = 0;
                  local_db0 = uVar20;
                  do {
                    sVar7 = 0x3f00000;
                    if ((uint)uVar20 < 0x3f00000) {
                      sVar7 = uVar20;
                    }
                    sVar12 = fread((void *)((ulong)uVar18 + (long)pfVar4),1,sVar7,pFVar10);
                    iVar5 = (int)sVar12;
                    uVar18 = uVar18 + iVar5;
                    uVar16 = (uint)uVar20 - iVar5;
                    uVar20 = (ulong)uVar16;
                  } while (((int)sVar7 == iVar5) && (uVar16 != 0));
                  if (uVar16 != 0) {
                    cimg::warn("cimg::fread() : Only %u/%u elements could be read from file.",
                               (ulong)uVar18,local_db0);
                  }
                  if (0 < (int)local_db8->_data[local_d78 & 0xffffffff]._height) {
                    pCVar13 = local_db8->_data + (local_d78 & 0xffffffff);
                    iVar5 = 0;
                    do {
                      uVar18 = pCVar13->_width;
                      if (0 < (int)uVar18) {
                        iVar17 = 0;
                        do {
                          pCVar13->_data[(pCVar13->_height * iVar25 + iVar5) * uVar18 + iVar17] =
                               (uchar)(int)(((float)*(byte *)((long)local_de8._data +
                                                             (ulong)(local_de8._width * iVar5 +
                                                                    iVar17)) * fVar1 + local_dc4) /
                                           (fVar2 * fVar1));
                          iVar17 = iVar17 + 1;
                          uVar18 = pCVar13->_width;
                        } while (iVar17 < (int)uVar18);
                      }
                      iVar5 = iVar5 + 1;
                    } while (iVar5 < (int)pCVar13->_height);
                  }
                }
                lVar24 = local_d70;
                this_00 = local_db8;
                if ((local_de8._is_shared == false) && (local_de8._data != (float *)0x0)) {
                  operator_delete__(local_de8._data);
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 < (int)local_d98._width);
            }
            if (((_stdin != local_d80) && (_stdout != local_d80)) &&
               (uVar18 = fclose(local_d80), uVar18 != 0)) {
              cimg::warn("cimg::fclose() : Error code %d returned during file closing.",
                         (ulong)uVar18);
            }
            if (((_stdin != pFVar10) && (_stdout != pFVar10)) &&
               (uVar18 = fclose(pFVar10), uVar18 != 0)) {
              cimg::warn("cimg::fclose() : Error code %d returned during file closing.",
                         (ulong)uVar18);
            }
            if (this_00->_width != 0) {
              CImgList<unsigned_int>::~CImgList(&local_da8);
              CImgList<float>::~CImgList(&local_d98);
              return this_00;
            }
            pCVar15 = (CImgIOException *)__cxa_allocate_exception(0x4008);
            CImgIOException::CImgIOException
                      (pCVar15,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_parrec() : Failed to recognize valid PAR-REC data in file \'%s\'."
                       ,(ulong)this_00->_width,(ulong)this_00->_allocated_width,this_00->_data,
                       "unsigned char",local_d50);
          }
          __cxa_throw(pCVar15,&CImgIOException::typeinfo,std::exception::~exception);
        }
        local_d58 = (float)local_dec;
        local_d5c = (float)local_d54;
        local_d60 = (float)local_dbc;
        local_d64 = (float)local_dc0;
        local_d68 = 0.0;
        CImg<float>::vector(&local_de8,&local_d58,&local_d5c,&local_d60,&local_d64,&local_d40,
                            &local_d3c,&local_d44,&local_d68);
        uVar20 = local_d98._0_8_ & 0xffffffff;
        pCVar8 = CImgList<float>::insert(&local_d98,1,local_d98._width);
        CImg<float>::move_to(&local_de8,pCVar8->_data + uVar20);
        if ((local_de8._is_shared == false) && (local_de8._data != (float *)0x0)) {
          operator_delete__(local_de8._data);
        }
        if (local_da8._width == 0) {
          uVar18 = 0;
        }
        else {
          ppuVar21 = &(local_da8._data)->_data;
          uVar16 = 0;
          do {
            uVar18 = uVar16;
            if ((*ppuVar21)[2] < local_dec) break;
            uVar16 = uVar16 + 1;
            ppuVar21 = ppuVar21 + 4;
            uVar18 = local_da8._width;
          } while (local_da8._width != uVar16);
        }
        if (uVar18 == local_da8._width) {
          CImg<unsigned_int>::vector
                    ((CImg<unsigned_int> *)&local_de8,&local_dbc,&local_dc0,&local_dec);
          uVar20 = local_da8._0_8_ & 0xffffffff;
          pCVar9 = CImgList<unsigned_int>::insert(&local_da8,1,local_da8._width);
          CImg<unsigned_int>::move_to((CImg<unsigned_int> *)&local_de8,pCVar9->_data + uVar20);
          if ((local_de8._is_shared == false) && (local_de8._data != (float *)0x0)) {
            operator_delete__(local_de8._data);
          }
        }
        else {
          puVar3 = local_da8._data[uVar18]._data;
          if (*puVar3 < local_dbc) {
            *puVar3 = local_dbc;
          }
          if (puVar3[1] < local_dc0) {
            puVar3[1] = local_dc0;
          }
          puVar3[2] = local_dec;
        }
        local_d98._data[local_d98._width - 1]._data[7] = (float)uVar18;
      } while( true );
    }
    pCVar15 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    CImgIOException::CImgIOException
              (pCVar15,"cimg::fopen() : Failed to open file \'%s\' with mode \'%s\'.",&local_938,"r"
              );
    ppuVar22 = &CImgIOException::typeinfo;
  }
  __cxa_throw(pCVar15,ppuVar22,std::exception::~exception);
}

Assistant:

CImgList<T>& load_parrec(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimglist_instance
                                    "load_parrec() : Specified filename is (null).",
                                    cimglist_instance);

      char body[1024] = { 0 }, filenamepar[1024] = { 0 }, filenamerec[1024] = { 0 };
      const char *const ext = cimg::split_filename(filename,body);
      if (!std::strcmp(ext,"par")) { std::strncpy(filenamepar,filename,sizeof(filenamepar)-1); cimg_snprintf(filenamerec,sizeof(filenamerec),"%s.rec",body); }
      if (!std::strcmp(ext,"PAR")) { std::strncpy(filenamepar,filename,sizeof(filenamepar)-1); cimg_snprintf(filenamerec,sizeof(filenamerec),"%s.REC",body); }
      if (!std::strcmp(ext,"rec")) { std::strncpy(filenamerec,filename,sizeof(filenamerec)-1); cimg_snprintf(filenamepar,sizeof(filenamepar),"%s.par",body); }
      if (!std::strcmp(ext,"REC")) { std::strncpy(filenamerec,filename,sizeof(filenamerec)-1); cimg_snprintf(filenamepar,sizeof(filenamepar),"%s.PAR",body); }
      std::FILE *file = cimg::fopen(filenamepar,"r");

      // Parse header file
      CImgList<floatT> st_slices;
      CImgList<uintT> st_global;
      int err;
      char line[256] = { 0 };
      do { err=std::fscanf(file,"%255[^\n]%*c",line); } while (err!=EOF && (*line=='#' || *line=='.'));
      do {
        unsigned int sn,sizex,sizey,pixsize;
        float rs,ri,ss;
        err = std::fscanf(file,"%u%*u%*u%*u%*u%*u%*u%u%*u%u%u%g%g%g%*[^\n]",&sn,&pixsize,&sizex,&sizey,&ri,&rs,&ss);
        if (err==7) {
          CImg<floatT>::vector((float)sn,(float)pixsize,(float)sizex,(float)sizey,ri,rs,ss,0).move_to(st_slices);
          unsigned int i; for (i = 0; i<st_global._width && sn<=st_global[i][2]; ++i) {}
          if (i==st_global._width) CImg<uintT>::vector(sizex,sizey,sn).move_to(st_global);
          else {
            CImg<uintT> &vec = st_global[i];
            if (sizex>vec[0]) vec[0] = sizex;
            if (sizey>vec[1]) vec[1] = sizey;
            vec[2] = sn;
          }
          st_slices[st_slices._width-1][7] = (float)i;
        }
      } while (err==7);

      // Read data
      std::FILE *file2 = cimg::fopen(filenamerec,"rb");
      cimglist_for(st_global,l) {
        const CImg<uintT>& vec = st_global[l];
        CImg<T>(vec[0],vec[1],vec[2]).move_to(*this);
      }

      cimglist_for(st_slices,l) {
        const CImg<floatT>& vec = st_slices[l];
        const unsigned int
          sn = (unsigned int)vec[0] - 1,
          pixsize = (unsigned int)vec[1],
          sizex = (unsigned int)vec[2],
          sizey = (unsigned int)vec[3],
          imn = (unsigned int)vec[7];
        const float ri = vec[4], rs = vec[5], ss = vec[6];
        switch (pixsize) {
        case 8 : {
          CImg<ucharT> buf(sizex,sizey);
          cimg::fread(buf._data,sizex*sizey,file2);
          if (cimg::endianness()) cimg::invert_endianness(buf._data,sizex*sizey);
          CImg<T>& img = (*this)[imn];
          cimg_forXY(img,x,y) img(x,y,sn) = (T)(( buf(x,y)*rs + ri )/(rs*ss));
        } break;
        case 16 : {
          CImg<ushortT> buf(sizex,sizey);
          cimg::fread(buf._data,sizex*sizey,file2);
          if (cimg::endianness()) cimg::invert_endianness(buf._data,sizex*sizey);
          CImg<T>& img = (*this)[imn];
          cimg_forXY(img,x,y) img(x,y,sn) = (T)(( buf(x,y)*rs + ri )/(rs*ss));
        } break;
        case 32 : {
          CImg<uintT> buf(sizex,sizey);
          cimg::fread(buf._data,sizex*sizey,file2);
          if (cimg::endianness()) cimg::invert_endianness(buf._data,sizex*sizey);
          CImg<T>& img = (*this)[imn];
          cimg_forXY(img,x,y) img(x,y,sn) = (T)(( buf(x,y)*rs + ri )/(rs*ss));
        } break;
        default :
          cimg::fclose(file);
          cimg::fclose(file2);
          throw CImgIOException(_cimglist_instance
                                "load_parrec() : Unsupported %d-bits pixel type for file '%s'.",
                                cimglist_instance,
                                pixsize,filename);
        }
      }
      cimg::fclose(file);
      cimg::fclose(file2);
      if (!_width)
        throw CImgIOException(_cimglist_instance
                              "load_parrec() : Failed to recognize valid PAR-REC data in file '%s'.",
                              cimglist_instance,
                              filename);
      return *this;
    }